

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  mbedtls_mpi T;
  mbedtls_mpi B;
  mbedtls_mpi local_68;
  char *local_58;
  size_t local_50;
  ulong local_48;
  mbedtls_mpi local_40;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  local_68.s = 1;
  local_68.n = 0;
  local_68.p = (mbedtls_mpi_uint *)0x0;
  cVar1 = *s;
  if (cVar1 == '\0') {
    mbedtls_mpi_free(X);
    return 0;
  }
  sVar4 = strlen(s + (cVar1 == '-'));
  if (radix == 0x10) {
    if (sVar4 >> 0x3e != 0) {
      return -4;
    }
    iVar3 = mbedtls_mpi_grow(X,((sVar4 >> 4) + 1) - (ulong)((sVar4 & 0xf) == 0));
    if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_grow(X,1), iVar3 != 0)) goto LAB_004a7bfd;
    memset(X->p,0,(ulong)X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (sVar4 != 0) {
      pcVar5 = s + (cVar1 == '-');
      bVar7 = 0;
      uVar8 = 0;
      do {
        pcVar5 = pcVar5 + -1;
        cVar2 = pcVar5[sVar4];
        iVar3 = (int)cVar2;
        uVar10 = (ulong)(iVar3 - 0x30);
        if (9 < (byte)(cVar2 - 0x30U)) {
          uVar10 = 0xff;
        }
        uVar11 = (ulong)(iVar3 - 0x37);
        if (5 < (byte)(cVar2 + 0xbfU)) {
          uVar11 = uVar10;
        }
        uVar10 = (ulong)(iVar3 - 0x57);
        if (5 < (byte)(cVar2 + 0x9fU)) {
          uVar10 = uVar11;
        }
        if (0xf < uVar10) goto LAB_004a7d52;
        X->p[uVar8 >> 4] = X->p[uVar8 >> 4] | uVar10 << (bVar7 & 0x3c);
        uVar8 = uVar8 + 1;
        bVar7 = bVar7 + 4;
      } while (sVar4 != uVar8);
    }
  }
  else {
    iVar3 = mbedtls_mpi_grow(X,1);
    if (iVar3 != 0) goto LAB_004a7bfd;
    memset(X->p,0,(ulong)X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (sVar4 != 0) {
      sVar9 = 0;
      local_58 = s + (cVar1 == '-');
      do {
        cVar2 = local_58[sVar9];
        iVar3 = (int)cVar2;
        uVar8 = (ulong)(iVar3 - 0x30);
        if (9 < (byte)(cVar2 - 0x30U)) {
          uVar8 = 0xff;
        }
        uVar10 = (ulong)(iVar3 - 0x37);
        if (5 < (byte)(cVar2 + 0xbfU)) {
          uVar10 = uVar8;
        }
        uVar8 = (ulong)(iVar3 - 0x57);
        if (5 < (byte)(cVar2 + 0x9fU)) {
          uVar8 = uVar10;
        }
        if ((uint)radix <= uVar8) goto LAB_004a7d52;
        local_50 = sVar9;
        iVar3 = mbedtls_mpi_mul_int(&local_68,X,(ulong)(uint)radix);
        if (iVar3 != 0) goto LAB_004a7bfd;
        local_40.s = 1;
        local_40.n = 1;
        local_40.p = &local_48;
        local_48 = uVar8;
        iVar3 = add_sub_mpi(X,&local_68,&local_40,1);
        if (iVar3 != 0) goto LAB_004a7bfd;
        sVar9 = local_50 + 1;
      } while (sVar4 != sVar9);
    }
  }
  iVar3 = 0;
  if ((cVar1 == '-') && (sVar6 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n), sVar6 != 0)) {
    X->s = -1;
  }
LAB_004a7bfd:
  if (local_68.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_68.p,(ulong)local_68.n << 3);
  }
  return iVar3;
LAB_004a7d52:
  iVar3 = -6;
  goto LAB_004a7bfd;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}